

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceStatement
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  Rep *pRVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  MethodDescriptorProto *pMVar5;
  ServiceOptions *pSVar6;
  Arena *arena;
  LocationRecorder location;
  LocationRecorder local_40;
  
  bVar3 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar3) {
    return true;
  }
  iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar4 == 0) {
    LocationRecorder::LocationRecorder(&local_40,service_location,3);
    *(byte *)(service->_has_bits_).has_bits_ = (byte)(service->_has_bits_).has_bits_[0] | 2;
    if (service->options_ == (ServiceOptions *)0x0) {
      uVar2 = (service->super_Message).super_MessageLite._internal_metadata_.ptr_;
      arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pSVar6 = Arena::CreateMaybeMessage<google::protobuf::ServiceOptions>(arena);
      service->options_ = pSVar6;
    }
    bVar3 = ParseOption(this,&service->options_->super_Message,&local_40,containing_file,
                        OPTION_STATEMENT);
    goto LAB_00346b29;
  }
  LocationRecorder::LocationRecorder
            (&local_40,service_location,2,
             (service->method_).super_RepeatedPtrFieldBase.current_size_);
  pRVar1 = (service->method_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar1 == (Rep *)0x0) {
LAB_00346aad:
    pMVar5 = Arena::CreateMaybeMessage<google::protobuf::MethodDescriptorProto>
                       ((service->method_).super_RepeatedPtrFieldBase.arena_);
    pMVar5 = (MethodDescriptorProto *)
             internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(service->method_).super_RepeatedPtrFieldBase,pMVar5);
  }
  else {
    iVar4 = (service->method_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar1->allocated_size <= iVar4) goto LAB_00346aad;
    (service->method_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
    pMVar5 = (MethodDescriptorProto *)pRVar1->elements[iVar4];
  }
  bVar3 = ParseServiceMethod(this,pMVar5,&local_40,containing_file);
LAB_00346b29:
  LocationRecorder::~LocationRecorder(&local_40);
  return bVar3;
}

Assistant:

bool Parser::ParseServiceStatement(ServiceDescriptorProto* service,
                                   const LocationRecorder& service_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kOptionsFieldNumber);
    return ParseOption(service->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kMethodFieldNumber,
                              service->method_size());
    return ParseServiceMethod(service->add_method(), location, containing_file);
  }
}